

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DArray.h
# Opt level: O0

DegreeTableEntry * __thiscall
ADS::DArray<ADS::DegreeTable<ADS::NodeDistancePairClass_*>::DegreeTableEntry_*>::add
          (DArray<ADS::DegreeTable<ADS::NodeDistancePairClass_*>::DegreeTableEntry_*> *this,
          uint uiIndex,DegreeTableEntry *element)

{
  DegreeTableEntry **ppDVar1;
  bool bVar2;
  uint uVar3;
  DegreeTableEntry *tmp;
  DegreeTableEntry *element_local;
  uint uiIndex_local;
  DArray<ADS::DegreeTable<ADS::NodeDistancePairClass_*>::DegreeTableEntry_*> *this_local;
  
  uVar3 = shiftIndex(this,uiIndex);
  bVar2 = checkBound(this,uVar3);
  if (bVar2) {
    ppDVar1 = this->_pDArray;
    uVar3 = shiftIndex(this,uiIndex);
    this_local = (DArray<ADS::DegreeTable<ADS::NodeDistancePairClass_*>::DegreeTableEntry_*> *)
                 ppDVar1[uVar3];
    ppDVar1 = this->_pDArray;
    uVar3 = shiftIndex(this,uiIndex);
    ppDVar1[uVar3] = element;
  }
  else {
    this_local = (DArray<ADS::DegreeTable<ADS::NodeDistancePairClass_*>::DegreeTableEntry_*> *)0x0;
  }
  return (DegreeTableEntry *)this_local;
}

Assistant:

T
    DArray<T>::add (unsigned int uiIndex, T element)
    {
        if (!checkBound (shiftIndex (uiIndex)))
            return NULL;
        T tmp = _pDArray[shiftIndex (uiIndex)];
        _pDArray[shiftIndex (uiIndex)] = element;
        return tmp;
    }